

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortA.c
# Opt level: O3

void burstsortA(string *strings,size_t scnt)

{
  int *piVar1;
  uint uVar2;
  byte *pbVar3;
  string puVar4;
  byte bVar5;
  TRIE_conflict *node;
  char **ppcVar6;
  TRIE_conflict *pTVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  TRIE_conflict *pTVar13;
  int *piVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  
  node = (TRIE_conflict *)calloc(1,0xd08);
  if (0 < (int)(uint)scnt) {
    uVar16 = 0;
    do {
      pbVar3 = strings[uVar16];
      uVar10 = (ulong)*pbVar3;
      bVar12 = 0;
      uVar9 = node->counts[uVar10];
      pTVar13 = node;
      while ((int)uVar9 < 0) {
        pTVar13 = (TRIE_conflict *)pTVar13->ptrs[uVar10];
        bVar12 = bVar12 + 1;
        uVar10 = (ulong)pbVar3[bVar12];
        uVar9 = pTVar13->counts[uVar10];
      }
      if (uVar9 == 0) {
        if ((char)uVar10 == '\0') {
          ppcVar6 = (char **)calloc(0x2000,8);
          pTVar13->ptrs[uVar10] = ppcVar6;
          if (ppcVar6 == (char **)0x0) goto LAB_001e10bf;
          pTVar13->nulltailptr = ppcVar6;
          *ppcVar6 = (char *)strings[uVar16];
          pTVar13->nulltailptr = pTVar13->nulltailptr + 1;
          pTVar13->counts[uVar10] = 1;
        }
        else {
          ppcVar6 = (char **)calloc(0x10,8);
          pTVar13->ptrs[uVar10] = ppcVar6;
          if (ppcVar6 == (char **)0x0) {
LAB_001e10bf:
            puts("Error: Out of memory ");
            exit(1);
          }
          puVar4 = strings[uVar16];
          pTVar13->counts[uVar10] = 1;
          *ppcVar6 = (char *)puVar4;
          pTVar13->levels[uVar10] = pTVar13->levels[uVar10] + '\x01';
        }
      }
      else if ((char)uVar10 == '\0') {
        *pTVar13->nulltailptr = (char *)pbVar3;
        ppcVar6 = pTVar13->nulltailptr;
        pTVar13->nulltailptr = ppcVar6 + 1;
        pTVar13->counts[uVar10] = uVar9 + 1;
        if ((uVar9 + 1) * -0x4002001 < 0x80041) {
          pcVar8 = (char *)calloc(0x2000,8);
          ppcVar6[1] = pcVar8;
          if (pcVar8 == (char *)0x0) goto LAB_001e10bf;
          pTVar13->nulltailptr = (char **)*pTVar13->nulltailptr;
        }
      }
      else {
        ppcVar6 = pTVar13->ptrs[uVar10];
        pTVar13->counts[uVar10] = uVar9 + 1;
        ppcVar6[uVar9] = (char *)pbVar3;
        if ((uVar9 < 0x1fff) && ((int)(bucket_inc[pTVar13->levels[uVar10]] - 1) <= (int)uVar9)) {
          ppcVar6 = pTVar13->ptrs[uVar10];
          bVar5 = pTVar13->levels[uVar10] + 1;
          pTVar13->levels[uVar10] = bVar5;
          ppcVar6 = (char **)realloc(ppcVar6,(ulong)bucket_inc[bVar5] << 3);
          pTVar13->ptrs[uVar10] = ppcVar6;
          if (ppcVar6 == (char **)0x0) goto LAB_001e10bf;
        }
        uVar9 = pTVar13->counts[uVar10];
        if (0x1fff < (int)uVar9) {
          piVar14 = pTVar13->counts + uVar10;
          do {
            pTVar7 = (TRIE_conflict *)calloc(1,0xd08);
            if (pTVar7 == (TRIE_conflict *)0x0) goto LAB_001e10bf;
            bVar12 = bVar12 + 1;
            uVar11 = 0;
            do {
              pcVar8 = pTVar13->ptrs[uVar10][uVar11];
              uVar15 = (ulong)(byte)pcVar8[bVar12];
              piVar1 = pTVar7->counts + uVar15;
              uVar2 = *piVar1;
              lVar17 = (long)(int)uVar2;
              if (lVar17 < 1) {
                if (uVar15 == 0) {
                  ppcVar6 = (char **)calloc(0x2000,8);
                  pTVar7->ptrs[0] = ppcVar6;
                  if (ppcVar6 == (char **)0x0) goto LAB_001e10bf;
                  pTVar7->nulltailptr = ppcVar6;
                  *ppcVar6 = pTVar13->ptrs[uVar10][uVar11];
                  pTVar7->nulltailptr = ppcVar6 + 1;
                  *piVar1 = uVar2 + 1;
                }
                else {
                  ppcVar6 = (char **)calloc(0x10,8);
                  pTVar7->ptrs[uVar15] = ppcVar6;
                  if (ppcVar6 == (char **)0x0) goto LAB_001e10bf;
                  pcVar8 = pTVar13->ptrs[uVar10][uVar11];
                  pTVar7->counts[uVar15] = uVar2 + 1;
                  ppcVar6[lVar17] = pcVar8;
                  pTVar7->levels[uVar15] = pTVar7->levels[uVar15] + '\x01';
                }
              }
              else if (uVar15 == 0) {
                *pTVar7->nulltailptr = pcVar8;
                ppcVar6 = pTVar7->nulltailptr;
                pTVar7->nulltailptr = ppcVar6 + 1;
                *piVar1 = uVar2 + 1;
                if ((uVar2 + 1) * -0x4002001 < 0x80041) {
                  pcVar8 = (char *)calloc(0x2000,8);
                  ppcVar6[1] = pcVar8;
                  if (pcVar8 == (char *)0x0) goto LAB_001e10bf;
                  pTVar7->nulltailptr = (char **)*pTVar7->nulltailptr;
                }
              }
              else {
                ppcVar6 = pTVar7->ptrs[uVar15];
                pTVar7->counts[uVar15] = uVar2 + 1;
                ppcVar6[lVar17] = pcVar8;
                if ((uVar2 < 0x1fff) &&
                   ((int)(bucket_inc[pTVar7->levels[uVar15]] - 1) <= (int)uVar2)) {
                  ppcVar6 = pTVar7->ptrs[uVar15];
                  bVar5 = pTVar7->levels[uVar15] + 1;
                  pTVar7->levels[uVar15] = bVar5;
                  ppcVar6 = (char **)realloc(ppcVar6,(ulong)bucket_inc[bVar5] << 3);
                  pTVar7->ptrs[uVar15] = ppcVar6;
                  if (ppcVar6 == (char **)0x0) goto LAB_001e10bf;
                }
              }
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
            free(pTVar13->ptrs[uVar10]);
            pTVar13->ptrs[uVar10] = (char **)pTVar7;
            *piVar14 = 0xffffffff;
          } while ((uVar15 != 0) &&
                  (uVar9 = pTVar7->counts[uVar15], pTVar13 = pTVar7, piVar14 = piVar1,
                  uVar10 = uVar15, 0x1fff < (int)uVar9));
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != ((uint)scnt & 0x7fffffff));
  }
  bursttraverseA(node,strings,0,0);
  return;
}

Assistant:

void
burstsortA(string strings[], size_t scnt)
{
    TRIE	*root;

    root = (TRIE *) calloc(1, sizeof(TRIE));

    (void) burstinsertA(root, strings, scnt);
    (void) bursttraverseA(root, strings, 0, 0);

    return;
}